

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::anon_unknown_6::GetGPrimPropertyNamesImpl
               (GPrim *gprim,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *prop_names,bool attr_prop,bool rel_prop)

{
  bool bVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
  *this;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>_>_>
  *this_00;
  ulong uVar2;
  string *psVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  pointer *this_01;
  reference __x;
  OpType *op;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *__range2;
  value_type local_360;
  allocator local_339;
  string local_338 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8 [32];
  string local_2b8 [32];
  undefined1 local_298 [8];
  string rel_name;
  string *coll_name;
  size_t i;
  string local_248 [8];
  string purpose_name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>
  *collection;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>_>_>
  *__range3_2;
  reference local_1e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>
  *item;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
  *__range3_1;
  value_type local_1c0;
  allocator local_199;
  value_type local_198;
  allocator local_171;
  value_type local_170;
  string local_150 [32];
  undefined1 local_130 [8];
  string varname;
  XformOp *xop;
  const_iterator __end3;
  const_iterator __begin3;
  vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *__range3;
  value_type local_e8;
  allocator local_c1;
  value_type local_c0;
  allocator local_99;
  value_type local_98;
  allocator local_71;
  value_type local_70;
  allocator local_49;
  value_type local_48;
  byte local_22;
  byte local_21;
  bool rel_prop_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  bool attr_prop_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *prop_names_local;
  GPrim *gprim_local;
  
  if (gprim == (GPrim *)0x0) {
    gprim_local._7_1_ = false;
  }
  else if (prop_names ==
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0) {
    gprim_local._7_1_ = false;
  }
  else {
    local_22 = rel_prop;
    local_21 = attr_prop;
    pvStack_20 = prop_names;
    prop_names_local =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)gprim;
    if (attr_prop) {
      bVar1 = TypedAttributeWithFallback<bool>::authored(&gprim->doubleSided);
      pvVar4 = pvStack_20;
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_48,"doubleSided",&local_49);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pvVar4,&local_48);
        ::std::__cxx11::string::~string((string *)&local_48);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_49);
      }
      bVar1 = TypedAttributeWithFallback<tinyusdz::Orientation>::authored
                        ((TypedAttributeWithFallback<tinyusdz::Orientation> *)
                         &prop_names_local[0xa4].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      pvVar4 = pvStack_20;
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_70,"orientation",&local_71);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pvVar4,&local_70);
        ::std::__cxx11::string::~string((string *)&local_70);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_71);
      }
      bVar1 = TypedAttributeWithFallback<tinyusdz::Purpose>::authored
                        ((TypedAttributeWithFallback<tinyusdz::Purpose> *)(prop_names_local + 0xd7))
      ;
      pvVar4 = pvStack_20;
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_98,"purpose",&local_99);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pvVar4,&local_98);
        ::std::__cxx11::string::~string((string *)&local_98);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_99);
      }
      bVar1 = TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_>::authored
                        ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *)
                         (prop_names_local + 0x73));
      pvVar4 = pvStack_20;
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_c0,"extent",&local_c1);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pvVar4,&local_c0);
        ::std::__cxx11::string::~string((string *)&local_c0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      }
      bVar1 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_>::authored
                        ((TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *)
                         (prop_names_local + 0xbc));
      pvVar4 = pvStack_20;
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_e8,"visibility",(allocator *)((long)&__range3 + 7));
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pvVar4,&local_e8);
        ::std::__cxx11::string::~string((string *)&local_e8);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
      }
      pvVar4 = prop_names_local;
      __end3 = ::std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::begin
                         ((vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)
                          prop_names_local);
      xop = (XformOp *)
            ::std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::end
                      ((vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)pvVar4);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_tinyusdz::XformOp_*,_std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>_>
                                         *)&xop), bVar1) {
        varname.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<const_tinyusdz::XformOp_*,_std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>_>
             ::operator*(&__end3);
        if (((reference)varname.field_2._8_8_)->op_type != ResetXformStack) {
          tinyusdz::to_string_abi_cxx11_((string *)local_130,(tinyusdz *)varname.field_2._8_8_,op);
          uVar2 = ::std::__cxx11::string::empty();
          if ((uVar2 & 1) == 0) {
            ::std::operator+((char *)local_150,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x62ccff);
            ::std::__cxx11::string::operator+=((string *)local_130,local_150);
            ::std::__cxx11::string::~string(local_150);
          }
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(pvStack_20,(value_type *)local_130);
          ::std::__cxx11::string::~string((string *)local_130);
        }
        __gnu_cxx::
        __normal_iterator<const_tinyusdz::XformOp_*,_std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>_>
        ::operator++(&__end3);
      }
    }
    if ((local_22 & 1) != 0) {
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                        ((optional *)
                         &prop_names_local[6].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar4 = pvStack_20;
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_170,"material:binding",&local_171);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pvVar4,&local_170);
        ::std::__cxx11::string::~string((string *)&local_170);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_171);
      }
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                        ((optional *)
                         &prop_names_local[0x27].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      pvVar4 = pvStack_20;
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_198,"material:binding:preview",&local_199);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pvVar4,&local_198);
        ::std::__cxx11::string::~string((string *)&local_198);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_199);
      }
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                        ((optional *)(prop_names_local + 0x48));
      pvVar4 = pvStack_20;
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_1c0,"material:binding:full",(allocator *)((long)&__range3_1 + 7)
                  );
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pvVar4,&local_1c0);
        ::std::__cxx11::string::~string((string *)&local_1c0);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range3_1 + 7));
      }
      this = MaterialBinding::materialBindingMap_abi_cxx11_
                       ((MaterialBinding *)
                        &prop_names_local[6].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __end3_1 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
                 ::begin(this);
      item = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>
              *)::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
                ::end(this);
      while (bVar1 = ::std::operator!=(&__end3_1,(_Self *)&item), bVar1) {
        local_1e8 = ::std::
                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>
                    ::operator*(&__end3_1);
        pvVar4 = pvStack_20;
        ::std::operator+((char *)&__range3_2,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "material:binding:");
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pvVar4,(value_type *)&__range3_2);
        ::std::__cxx11::string::~string((string *)&__range3_2);
        ::std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>
        ::operator++(&__end3_1);
      }
      this_00 = MaterialBinding::materialBindingCollectionMap_abi_cxx11_
                          ((MaterialBinding *)
                           &prop_names_local[6].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __end3_2 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>_>_>
                 ::begin(this_00);
      collection = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>
                    *)::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>_>_>
                      ::end(this_00);
      while (bVar1 = ::std::operator!=(&__end3_2,(_Self *)&collection), bVar1) {
        purpose_name.field_2._8_8_ =
             ::std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>_>
             ::operator*(&__end3_2);
        ::std::__cxx11::string::string(local_248);
        uVar2 = ::std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          ::std::operator+((char *)&i,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x62ccff);
          ::std::__cxx11::string::operator=(local_248,(string *)&i);
          ::std::__cxx11::string::~string((string *)&i);
        }
        for (coll_name = (string *)0x0;
            psVar3 = (string *)
                     ordered_dict<tinyusdz::Relationship>::size
                               ((ordered_dict<tinyusdz::Relationship> *)
                                (purpose_name.field_2._8_8_ + 0x20)), coll_name < psVar3;
            coll_name = (string *)&coll_name->field_0x1) {
          pvVar4 = ordered_dict<tinyusdz::Relationship>::keys_abi_cxx11_
                             ((ordered_dict<tinyusdz::Relationship> *)
                              (purpose_name.field_2._8_8_ + 0x20));
          rel_name.field_2._8_8_ =
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)pvVar4,(size_type)coll_name);
          ::std::__cxx11::string::string((string *)local_298);
          uVar2 = ::std::__cxx11::string::empty();
          if ((uVar2 & 1) == 0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_338,":",&local_339);
            ::std::operator+((char *)local_318,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "material:binding:collection");
            ::std::operator+(local_2f8,local_318);
            ::std::operator+(local_2d8,local_2f8);
            ::std::__cxx11::string::operator=((string *)local_298,(string *)local_2d8);
            ::std::__cxx11::string::~string((string *)local_2d8);
            ::std::__cxx11::string::~string((string *)local_2f8);
            ::std::__cxx11::string::~string((string *)local_318);
            ::std::__cxx11::string::~string(local_338);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_339);
          }
          else {
            ::std::operator+((char *)local_2b8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "material:binding:collection");
            ::std::__cxx11::string::operator=((string *)local_298,local_2b8);
            ::std::__cxx11::string::~string(local_2b8);
          }
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(pvStack_20,(value_type *)local_298);
          ::std::__cxx11::string::~string((string *)local_298);
        }
        ::std::__cxx11::string::~string(local_248);
        ::std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>_>
        ::operator++(&__end3_2);
      }
      bVar1 = RelationshipProperty::authored
                        ((RelationshipProperty *)
                         &prop_names_local[0xee].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar4 = pvStack_20;
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_360,"proxyPrim",(allocator *)((long)&__range2 + 7));
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pvVar4,&local_360);
        ::std::__cxx11::string::~string((string *)&local_360);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
      }
    }
    this_01 = &prop_names_local[0x10f].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    __end2 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)this_01);
    prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>
            *)::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     *)this_01);
    while (bVar1 = ::std::operator!=(&__end2,(_Self *)&prop), bVar1) {
      __x = ::std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
            ::operator*(&__end2);
      bVar1 = Property::is_relationship(&__x->second);
      if (bVar1) {
        if ((local_22 & 1) != 0) {
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(pvStack_20,&__x->first);
        }
      }
      else if ((local_21 & 1) != 0) {
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pvStack_20,&__x->first);
      }
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
      ::operator++(&__end2);
    }
    gprim_local._7_1_ = true;
  }
  return gprim_local._7_1_;
}

Assistant:

bool GetGPrimPropertyNamesImpl(const GPrim *gprim,
                               std::vector<std::string> *prop_names,
                               bool attr_prop, bool rel_prop) {
  if (!gprim) {
    return false;
  }

  if (!prop_names) {
    return false;
  }

  if (attr_prop) {
    if (gprim->doubleSided.authored()) {
      prop_names->push_back("doubleSided");
    }

    if (gprim->orientation.authored()) {
      prop_names->push_back("orientation");
    }

    if (gprim->purpose.authored()) {
      prop_names->push_back("purpose");
    }

    if (gprim->extent.authored()) {
      prop_names->push_back("extent");
    }

    if (gprim->visibility.authored()) {
      prop_names->push_back("visibility");
    }

    // xformOps.
    for (const auto &xop : gprim->xformOps) {
      if (xop.op_type == XformOp::OpType::ResetXformStack) {
        // skip
        continue;
      }
      std::string varname = to_string(xop.op_type);
      if (!xop.suffix.empty()) {
        varname += ":" + xop.suffix;
      }
      prop_names->push_back(varname);
    }
  }

  if (rel_prop) {
    if (gprim->materialBinding) {
      prop_names->push_back(kMaterialBinding);
    }

    if (gprim->materialBindingPreview) {
      prop_names->push_back(kMaterialBindingPreview);
    }

    if (gprim->materialBindingFull) {
      prop_names->push_back(kMaterialBindingFull);
    }

    for (const auto &item : gprim->materialBindingMap()) {
      prop_names->push_back("material:binding:" + item.first);
    }

    for (const auto &collection : gprim->materialBindingCollectionMap()) {
      std::string purpose_name;
      if (!collection.first.empty()) {
        purpose_name = ":" + collection.first;
      }

      for (size_t i = 0; i < collection.second.size(); i++) {
        const std::string &coll_name = collection.second.keys()[i];
        std::string rel_name;
        if (collection.first.empty()) {
          rel_name = kMaterialBindingCollection + purpose_name;
        } else {
          rel_name = kMaterialBindingCollection + std::string(":") + coll_name +
                     purpose_name;
        }

        prop_names->push_back(rel_name);
      }
    }

    if (gprim->proxyPrim.authored()) {
      prop_names->push_back("proxyPrim");
    }
  }

  // other props
  for (const auto &prop : gprim->props) {
    if (prop.second.is_relationship()) {
      if (rel_prop) {
        prop_names->push_back(prop.first);
      }
    } else {  // assume attribute
      if (attr_prop) {
        prop_names->push_back(prop.first);
      }
    }
  }

  return true;
}